

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O3

bool __thiscall llvm::APInt::operator==(APInt *this,uint64_t Val)

{
  uint uVar1;
  uint uVar2;
  uint64_t uVar3;
  
  uVar1 = this->BitWidth;
  if ((0x40 < uVar1) && (uVar2 = countLeadingZerosSlowCase(this), 0x40 < uVar1 - uVar2)) {
    return false;
  }
  uVar3 = getZExtValue(this);
  return uVar3 == Val;
}

Assistant:

bool operator==(uint64_t Val) const {
    return (isSingleWord() || getActiveBits() <= 64) && getZExtValue() == Val;
  }